

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec32.c
# Opt level: O0

void Hacl_Chacha20_Vec32_chacha20_decrypt_32
               (uint32_t len,uint8_t *out,uint8_t *cipher,uint8_t *key,uint8_t *n,uint32_t ctr)

{
  uint ctr_00;
  uint32_t uVar1;
  __uint32_t _Var2;
  uint8_t *b;
  uint32_t y_31;
  uint32_t x_31;
  uint32_t u_31;
  uint32_t y_30;
  uint32_t x_30;
  uint32_t u_30;
  uint32_t y_29;
  uint32_t x_29;
  uint32_t u_29;
  uint32_t y_28;
  uint32_t x_28;
  uint32_t u_28;
  uint32_t y_27;
  uint32_t x_27;
  uint32_t u_27;
  uint32_t y_26;
  uint32_t x_26;
  uint32_t u_26;
  uint32_t y_25;
  uint32_t x_25;
  uint32_t u_25;
  uint32_t y_24;
  uint32_t x_24;
  uint32_t u_24;
  uint32_t y_23;
  uint32_t x_23;
  uint32_t u_23;
  uint32_t y_22;
  uint32_t x_22;
  uint32_t u_22;
  uint32_t y_21;
  uint32_t x_21;
  uint32_t u_21;
  uint32_t y_20;
  uint32_t x_20;
  uint32_t u_20;
  uint32_t y_19;
  uint32_t x_19;
  uint32_t u_19;
  uint32_t y_18;
  uint32_t x_18;
  uint32_t u_18;
  uint32_t y_17;
  uint32_t x_17;
  uint32_t u_17;
  uint32_t y_16;
  uint32_t x_16;
  uint32_t u_16;
  uint32_t i_1;
  uint32_t k_1 [16];
  uint8_t plain [64];
  uint8_t *uu____2;
  uint32_t y_15;
  uint32_t x_15;
  uint32_t u_15;
  uint32_t y_14;
  uint32_t x_14;
  uint32_t u_14;
  uint32_t y_13;
  uint32_t x_13;
  uint32_t u_13;
  uint32_t y_12;
  uint32_t x_12;
  uint32_t u_12;
  uint32_t y_11;
  uint32_t x_11;
  uint32_t u_11;
  uint32_t y_10;
  uint32_t x_10;
  uint32_t u_10;
  uint32_t y_9;
  uint32_t x_9;
  uint32_t u_9;
  uint32_t y_8;
  uint32_t x_8;
  uint32_t u_8;
  uint32_t y_7;
  uint32_t x_7;
  uint32_t u_7;
  uint32_t y_6;
  uint32_t x_6;
  uint32_t u_6;
  uint32_t y_5;
  uint32_t x_5;
  uint32_t u_5;
  uint32_t y_4;
  uint32_t x_4;
  uint32_t u_4;
  uint32_t y_3;
  uint32_t x_3;
  uint32_t u_3;
  uint32_t y_2;
  uint32_t x_2;
  uint32_t u_2;
  uint32_t y_1;
  uint32_t x_1;
  uint32_t u_1;
  uint32_t y;
  uint32_t x;
  uint32_t u;
  uint32_t i;
  uint32_t k [16];
  uint8_t *uu____1;
  uint8_t *uu____0;
  uint32_t i0;
  uint32_t rem1;
  uint32_t nb;
  uint32_t rem;
  uint32_t ctx [16];
  uint32_t ctr_local;
  uint8_t *n_local;
  uint8_t *key_local;
  uint8_t *cipher_local;
  uint8_t *out_local;
  uint32_t len_local;
  
  ctx[0xf] = ctr;
  memset(&nb,0,0x40);
  chacha20_init_32(&nb,key,n,ctx[0xf]);
  ctr_00 = len >> 6;
  for (uu____0._0_4_ = 0; (uint32_t)uu____0 < ctr_00; uu____0._0_4_ = (uint32_t)uu____0 + 1) {
    b = out + ((uint32_t)uu____0 << 6);
    k._56_8_ = cipher + ((uint32_t)uu____0 << 6);
    memset(&u,0,0x40);
    chacha20_core_32(&u,&nb,(uint32_t)uu____0);
    uVar1 = load32((uint8_t *)k._56_8_);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ u);
    store32(b,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 4));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ i);
    store32(b + 4,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 8));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[0]);
    store32(b + 8,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0xc));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[1]);
    store32(b + 0xc,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x10));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[2]);
    store32(b + 0x10,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x14));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[3]);
    store32(b + 0x14,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x18));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[4]);
    store32(b + 0x18,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x1c));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[5]);
    store32(b + 0x1c,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x20));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[6]);
    store32(b + 0x20,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x24));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[7]);
    store32(b + 0x24,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x28));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[8]);
    store32(b + 0x28,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x2c));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[9]);
    store32(b + 0x2c,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x30));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[10]);
    store32(b + 0x30,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x34));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[0xb]);
    store32(b + 0x34,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x38));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[0xc]);
    store32(b + 0x38,_Var2);
    uVar1 = load32((uint8_t *)(k._56_8_ + 0x3c));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k[0xd]);
    store32(b + 0x3c,_Var2);
  }
  if ((len & 0x3f) != 0) {
    memset(k_1 + 0xe,0,0x40);
    memcpy(k_1 + 0xe,cipher + (ctr_00 << 6),(ulong)(len & 0x3f));
    memset(&u_16,0,0x40);
    chacha20_core_32(&u_16,&nb,ctr_00);
    uVar1 = load32((uint8_t *)(k_1 + 0xe));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ u_16);
    store32((uint8_t *)(k_1 + 0xe),_Var2);
    uVar1 = load32((uint8_t *)(k_1 + 0xf));
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ i_1);
    store32((uint8_t *)(k_1 + 0xf),_Var2);
    uVar1 = load32(plain);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[0]);
    store32(plain,_Var2);
    uVar1 = load32(plain + 4);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[1]);
    store32(plain + 4,_Var2);
    uVar1 = load32(plain + 8);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[2]);
    store32(plain + 8,_Var2);
    uVar1 = load32(plain + 0xc);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[3]);
    store32(plain + 0xc,_Var2);
    uVar1 = load32(plain + 0x10);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[4]);
    store32(plain + 0x10,_Var2);
    uVar1 = load32(plain + 0x14);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[5]);
    store32(plain + 0x14,_Var2);
    uVar1 = load32(plain + 0x18);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[6]);
    store32(plain + 0x18,_Var2);
    uVar1 = load32(plain + 0x1c);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[7]);
    store32(plain + 0x1c,_Var2);
    uVar1 = load32(plain + 0x20);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[8]);
    store32(plain + 0x20,_Var2);
    uVar1 = load32(plain + 0x24);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[9]);
    store32(plain + 0x24,_Var2);
    uVar1 = load32(plain + 0x28);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[10]);
    store32(plain + 0x28,_Var2);
    uVar1 = load32(plain + 0x2c);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[0xb]);
    store32(plain + 0x2c,_Var2);
    uVar1 = load32(plain + 0x30);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[0xc]);
    store32(plain + 0x30,_Var2);
    uVar1 = load32(plain + 0x34);
    _Var2 = __uint32_identity(uVar1);
    _Var2 = __uint32_identity(_Var2 ^ k_1[0xd]);
    store32(plain + 0x34,_Var2);
    memcpy(out + (ctr_00 << 6),k_1 + 0xe,(ulong)(len & 0x3f));
  }
  return;
}

Assistant:

void
Hacl_Chacha20_Vec32_chacha20_decrypt_32(
  uint32_t len,
  uint8_t *out,
  uint8_t *cipher,
  uint8_t *key,
  uint8_t *n,
  uint32_t ctr
)
{
  uint32_t ctx[16U] = { 0U };
  chacha20_init_32(ctx, key, n, ctr);
  uint32_t rem = len % 64U;
  uint32_t nb = len / 64U;
  uint32_t rem1 = len % 64U;
  for (uint32_t i0 = 0U; i0 < nb; i0++)
  {
    uint8_t *uu____0 = out + i0 * 64U;
    uint8_t *uu____1 = cipher + i0 * 64U;
    uint32_t k[16U] = { 0U };
    chacha20_core_32(k, ctx, i0);
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      uint32_t u = load32_le(uu____1 + i * 4U);
      uint32_t x = u;
      uint32_t y = x ^ k[i];
      store32_le(uu____0 + i * 4U, y););
  }
  if (rem1 > 0U)
  {
    uint8_t *uu____2 = out + nb * 64U;
    uint8_t plain[64U] = { 0U };
    memcpy(plain, cipher + nb * 64U, rem * sizeof (uint8_t));
    uint32_t k[16U] = { 0U };
    chacha20_core_32(k, ctx, nb);
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      uint32_t u = load32_le(plain + i * 4U);
      uint32_t x = u;
      uint32_t y = x ^ k[i];
      store32_le(plain + i * 4U, y););
    memcpy(uu____2, plain, rem * sizeof (uint8_t));
  }
}